

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line<charls::transform_hp1<unsigned_short>::inverse,unsigned_short>
               (quad<unsigned_short> *destination,quad<unsigned_short> *source,size_t pixel_count,
               inverse *transform)

{
  triplet<unsigned_short> triplet_value;
  quad<unsigned_short> local_38;
  inverse *local_30;
  size_t i;
  inverse *transform_local;
  size_t pixel_count_local;
  quad<unsigned_short> *source_local;
  quad<unsigned_short> *destination_local;
  
  i = (size_t)transform;
  transform_local = (inverse *)pixel_count;
  pixel_count_local = (size_t)source;
  source_local = destination;
  for (local_30 = (inverse *)0x0; local_30 < transform_local; local_30 = local_30 + 1) {
    triplet_value =
         transform_hp1<unsigned_short>::inverse::operator()
                   ((inverse *)i,(uint)*(ushort *)(pixel_count_local + (long)local_30 * 8),
                    (uint)*(ushort *)(pixel_count_local + 2 + (long)local_30 * 8),
                    (uint)*(ushort *)(pixel_count_local + 4 + (long)local_30 * 8));
    quad<unsigned_short>::quad
              (&local_38,triplet_value,(uint)*(ushort *)(pixel_count_local + 6 + (long)local_30 * 8)
              );
    source_local[(long)local_30] = local_38;
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = quad<PixelType>(transform(source[i].v1, source[i].v2, source[i].v3), source[i].v4);
    }
}